

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int selectWindowRewriteExprCb(Walker *pWalker,Expr *pExpr)

{
  long *plVar1;
  uint uVar2;
  sqlite3 *db;
  ExprList *pEVar3;
  byte *in_RSI;
  undefined8 *in_RDI;
  Expr *pDup;
  Window *pWin;
  int i;
  int nSrc;
  Parse *pParse;
  WindowRewrite *p;
  undefined4 in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  Expr *in_stack_ffffffffffffffc8;
  long lVar4;
  int in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  Parse *pParse_00;
  
  plVar1 = (long *)in_RDI[5];
  pParse_00 = (Parse *)*in_RDI;
  if (plVar1[3] != 0) {
    if (*in_RSI != 0x9e) {
      return 0;
    }
    in_stack_ffffffffffffffd4 = *(int *)plVar1[1];
    in_stack_ffffffffffffffd0 = 0;
    while ((in_stack_ffffffffffffffd0 < in_stack_ffffffffffffffd4 &&
           (*(int *)(in_RSI + 0x2c) !=
            *(int *)(plVar1[1] + (long)in_stack_ffffffffffffffd0 * 0x70 + 0x48)))) {
      in_stack_ffffffffffffffd0 = in_stack_ffffffffffffffd0 + 1;
    }
    if (in_stack_ffffffffffffffd0 == in_stack_ffffffffffffffd4) {
      return 0;
    }
  }
  uVar2 = (uint)*in_RSI;
  if (uVar2 == 0x9d) {
    if ((*(uint *)(in_RSI + 4) & 0x1000000) == 0) {
      return 0;
    }
    for (lVar4 = *plVar1; lVar4 != 0; lVar4 = *(long *)(lVar4 + 0x30)) {
      if (*(long *)(in_RSI + 0x40) == lVar4) {
        return 1;
      }
    }
    in_stack_ffffffffffffffc8 = (Expr *)0x0;
  }
  else if (1 < uVar2 - 0x9e) {
    return 0;
  }
  db = (sqlite3 *)
       sqlite3ExprDup((sqlite3 *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                      in_stack_ffffffffffffffc8,(int)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
  pEVar3 = sqlite3ExprListAppend
                     (pParse_00,
                      (ExprList *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                      in_stack_ffffffffffffffc8);
  plVar1[2] = (long)pEVar3;
  if (plVar1[2] != 0) {
    *(uint *)(in_RSI + 4) = *(uint *)(in_RSI + 4) | 0x8000;
    sqlite3ExprDelete(db,(Expr *)CONCAT44(uVar2,in_stack_ffffffffffffffb8));
    *(uint *)(in_RSI + 4) = *(uint *)(in_RSI + 4) & 0xffff7fff;
    memset(in_RSI,0,0x48);
    *in_RSI = 0x9e;
    *(short *)(in_RSI + 0x30) = (short)*(undefined4 *)plVar1[2] + -1;
    *(undefined4 *)(in_RSI + 0x2c) = *(undefined4 *)(*plVar1 + 0x48);
  }
  return 0;
}

Assistant:

static int selectWindowRewriteExprCb(Walker *pWalker, Expr *pExpr){
  struct WindowRewrite *p = pWalker->u.pRewrite;
  Parse *pParse = pWalker->pParse;

  /* If this function is being called from within a scalar sub-select
  ** that used by the SELECT statement being processed, only process
  ** TK_COLUMN expressions that refer to it (the outer SELECT). Do
  ** not process aggregates or window functions at all, as they belong
  ** to the scalar sub-select.  */
  if( p->pSubSelect ){
    if( pExpr->op!=TK_COLUMN ){
      return WRC_Continue;
    }else{
      int nSrc = p->pSrc->nSrc;
      int i;
      for(i=0; i<nSrc; i++){
        if( pExpr->iTable==p->pSrc->a[i].iCursor ) break;
      }
      if( i==nSrc ) return WRC_Continue;
    }
  }

  switch( pExpr->op ){

    case TK_FUNCTION:
      if( !ExprHasProperty(pExpr, EP_WinFunc) ){
        break;
      }else{
        Window *pWin;
        for(pWin=p->pWin; pWin; pWin=pWin->pNextWin){
          if( pExpr->y.pWin==pWin ){
            assert( pWin->pOwner==pExpr );
            return WRC_Prune;
          }
        }
      }
      /* Fall through.  */

    case TK_AGG_FUNCTION:
    case TK_COLUMN: {
      Expr *pDup = sqlite3ExprDup(pParse->db, pExpr, 0);
      p->pSub = sqlite3ExprListAppend(pParse, p->pSub, pDup);
      if( p->pSub ){
        assert( ExprHasProperty(pExpr, EP_Static)==0 );
        ExprSetProperty(pExpr, EP_Static);
        sqlite3ExprDelete(pParse->db, pExpr);
        ExprClearProperty(pExpr, EP_Static);
        memset(pExpr, 0, sizeof(Expr));

        pExpr->op = TK_COLUMN;
        pExpr->iColumn = p->pSub->nExpr-1;
        pExpr->iTable = p->pWin->iEphCsr;
      }

      break;
    }

    default: /* no-op */
      break;
  }

  return WRC_Continue;
}